

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O2

void __thiscall
bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short>::save_to_file
          (bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short> *this,string *base_path)

{
  dna_bwt_n<dna_string_n> **ppdVar1;
  uint64_t uVar2;
  uint64_t i_00;
  uint64_t i;
  ulong uVar3;
  uint64_t i_1;
  bool bVar4;
  reference rVar5;
  char c;
  string lcp_path;
  string da_path;
  string bwt_path;
  ofstream out;
  
  std::__cxx11::string::string((string *)&bwt_path,(string *)base_path);
  std::__cxx11::string::append((char *)&bwt_path);
  std::__cxx11::string::string((string *)&da_path,(string *)base_path);
  std::__cxx11::string::append((char *)&da_path);
  std::__cxx11::string::string((string *)&lcp_path,(string *)base_path);
  std::__cxx11::string::append((char *)&lcp_path);
  std::ofstream::ofstream(&out,(string *)&bwt_path,_S_out);
  uVar2 = 0;
  for (uVar3 = 0; uVar3 < this->n; uVar3 = uVar3 + 1) {
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->DA,uVar3);
    bVar4 = (*rVar5._M_p & rVar5._M_mask) == 0;
    ppdVar1 = &this->bwt2;
    if (bVar4) {
      ppdVar1 = &this->bwt1;
    }
    i_00 = uVar3 - uVar2;
    if (!bVar4) {
      i_00 = uVar2;
    }
    c = dna_string_n::operator[](&(*ppdVar1)->BWT,i_00);
    std::ostream::write((char *)&out,(long)&c);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->DA,uVar3);
    uVar2 = (uVar2 + 1) - (ulong)((rVar5._M_mask & *rVar5._M_p) == 0);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  if (this->out_da == true) {
    std::ofstream::ofstream(&out,(string *)&da_path,_S_out);
    for (uVar3 = 0; uVar3 < this->n; uVar3 = uVar3 + 1) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->DA,uVar3);
      c = (*rVar5._M_p & rVar5._M_mask) == 0 ^ 0x31;
      std::ostream::write((char *)&out,(long)&c);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
  }
  if ((this->LCP).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->LCP).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::ofstream::ofstream(&out,(string *)&lcp_path,_S_out);
    std::ostream::write((char *)&out,
                        (long)(this->LCP).
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
  }
  std::__cxx11::string::~string((string *)&lcp_path);
  std::__cxx11::string::~string((string *)&da_path);
  std::__cxx11::string::~string((string *)&bwt_path);
  return;
}

Assistant:

void save_to_file(string base_path){

		string bwt_path = base_path;
		bwt_path.append(".bwt");

		string da_path = base_path;
		da_path.append(".da");

		string lcp_path = base_path;
		lcp_path.append(".lcp");

		{
			std::ofstream out(bwt_path);

			uint64_t rank1 = 0;
			for(uint64_t i=0;i<n;++i){

				char c = DA[i]==0 ? bwt1->operator[](i-rank1) : bwt2->operator[](rank1);

				out.write((char*)&c,sizeof(c));

				rank1 += DA[i];

			}
			out.close();
		}

		if(out_da){
			std::ofstream out(da_path);
			for(uint64_t i=0;i<n;++i){

				uint8_t c = DA[i] ? '1' : '0';
				out.write((char*)&c,sizeof(c));

			}
			out.close();
		}

		if(LCP.size()>0){

			std::ofstream out(lcp_path);

			out.write((char*)LCP.data(),LCP.size() * sizeof(lcp_int_t));

			out.close();

		}

	}